

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_compiler.hpp
# Opt level: O0

sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
boost::xpressive::
regex_compiler<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>>
::parse_atom<char_const*>
          (regex_compiler<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>
           *this,char **begin,char *end)

{
  undefined8 uVar1;
  compiler_token_type cVar2;
  traits_type *ptVar3;
  ulong uVar4;
  long *in_RDX;
  regex_compiler<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>
  *in_RSI;
  sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  bool bVar5;
  escape_value eVar6;
  char *old_begin;
  escape_value esc;
  char *in_stack_000003e8;
  char **in_stack_000003f0;
  regex_compiler<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>
  *in_stack_000003f8;
  char_type in_stack_fffffffffffffe1f;
  regex_compiler<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>
  *in_stack_fffffffffffffe20;
  source_location *in_stack_fffffffffffffe28;
  source_location *this_00;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
  *in_stack_fffffffffffffe38;
  error_type code;
  regex_compiler<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>
  *in_stack_fffffffffffffe40;
  assert_bos_matcher *in_stack_fffffffffffffe48;
  syntax_option_type sVar7;
  sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *begin_00;
  string_type *in_stack_fffffffffffffea8;
  string local_100 [32];
  source_location local_e0;
  char *in_stack_ffffffffffffff38;
  char **in_stack_ffffffffffffff40;
  regex_compiler<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>
  *in_stack_ffffffffffffff48;
  undefined8 local_84;
  undefined8 uStack_7c;
  string local_60 [32];
  long local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  long *local_18;
  
  local_38 = 0;
  uStack_30 = 0;
  local_40 = *in_RDX;
  begin_00 = in_RDI;
  local_18 = in_RDX;
  cVar2 = compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
          ::get_token<char_const*>
                    (in_stack_fffffffffffffe38,
                     (char **)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                     (char *)in_stack_fffffffffffffe28);
  uVar4 = (ulong)cVar2;
  code = (error_type)((ulong)in_stack_fffffffffffffe38 >> 0x20);
  switch(uVar4) {
  case 0:
    parse_literal<char_const*>
              (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    sVar7 = (syntax_option_type)(uVar4 >> 0x20);
    compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
    ::flags(&in_RSI->traits_);
    regex_compiler<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>
    ::rxtraits((regex_compiler<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>
                *)0x1466ad);
    detail::
    make_literal_xpression<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
              (in_stack_fffffffffffffea8,sVar7,
               (regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> *)in_RSI);
    std::__cxx11::string::~string(local_60);
    break;
  case 1:
    compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
    ::flags(&in_RSI->traits_);
    sVar7 = (syntax_option_type)((ulong)in_stack_fffffffffffffe48 >> 0x20);
    regex_compiler<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>
    ::rxtraits((regex_compiler<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>
                *)0x14672b);
    detail::
    make_any_xpression<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
              (sVar7,(regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> *)
                     in_stack_fffffffffffffe40);
    break;
  case 2:
    eVar6 = parse_escape<char_const*>
                      (in_stack_fffffffffffffe40,(char **)in_stack_fffffffffffffe38,
                       (char *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
    local_84 = eVar6._0_8_;
    uStack_7c = eVar6._8_8_;
    local_38 = local_84;
    uStack_30 = uStack_7c;
    uVar1 = uStack_30;
    uStack_30._4_4_ = eVar6.type_;
    uStack_30 = uVar1;
    if (uStack_30._4_4_ == escape_char) {
      compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
      ::flags(&in_RSI->traits_);
      regex_compiler<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>
      ::rxtraits((regex_compiler<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>
                  *)0x14693a);
      detail::
      make_char_xpression<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
                ((char)((ulong)in_stack_fffffffffffffe38 >> 0x38),
                 (syntax_option_type)in_stack_fffffffffffffe38,
                 (regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> *)
                 CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
      return begin_00;
    }
    if (uStack_30._4_4_ == escape_mark) {
      compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
      ::flags(&in_RSI->traits_);
      regex_compiler<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>
      ::rxtraits((regex_compiler<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>
                  *)0x1468f3);
      detail::
      make_backref_xpression<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
                ((int)((ulong)in_stack_fffffffffffffe38 >> 0x20),
                 (syntax_option_type)in_stack_fffffffffffffe38,
                 (regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> *)
                 CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
      return begin_00;
    }
    bVar5 = uStack_30._4_4_ == escape_class;
    if (bVar5) {
      *local_18 = *local_18 + 1;
      regex_compiler<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>
      ::is_upper_(in_stack_fffffffffffffe20,in_stack_fffffffffffffe1f);
      compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
      ::flags(&in_RSI->traits_);
      regex_compiler<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>
      ::rxtraits((regex_compiler<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>
                  *)0x1469af);
      detail::
      make_posix_charset_xpression<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
                ((char_class_type)((ulong)in_stack_fffffffffffffe38 >> 0x30),
                 SUB81((ulong)in_stack_fffffffffffffe38 >> 0x28,0),
                 (syntax_option_type)in_stack_fffffffffffffe38,
                 (regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> *)
                 CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
      return begin_00;
    }
  case 3:
    parse_group<char_const*>(in_stack_000003f8,in_stack_000003f0,in_stack_000003e8);
    break;
  default:
    *local_18 = local_40;
    goto LAB_00146bd6;
  case 6:
    regex_error::regex_error
              ((regex_error *)&stack0xffffffffffffff38,code,
               (char *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
    source_location::source_location
              (&local_e0,
               "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O0/KWStyle/Utilities/boost/xpressive/regex_compiler.hpp"
               ,0x231,
               "detail::sequence<BidiIter> boost::xpressive::regex_compiler<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>::parse_atom(FwdIter &, FwdIter) [BidiIter = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, RegexTraits = boost::xpressive::regex_traits<char>, CompilerTraits = boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char>>, FwdIter = const char *]"
               ,0);
    throw_exception<boost::xpressive::regex_error>
              ((regex_error *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
               in_stack_fffffffffffffe28);
  case 7:
    parse_charset<char_const*>(in_RSI,(char **)begin_00,&in_RDI->pure_);
    break;
  case 0x12:
    parse_quote_meta<char_const*>(in_RSI,(char **)begin_00,&in_RDI->pure_);
    sVar7 = (syntax_option_type)(uVar4 >> 0x20);
    compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
    ::flags(&in_RSI->traits_);
    regex_compiler<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>
    ::rxtraits((regex_compiler<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>
                *)0x146aeb);
    detail::
    make_literal_xpression<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
              (in_stack_fffffffffffffea8,sVar7,
               (regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> *)in_RSI);
    std::__cxx11::string::~string(local_100);
    break;
  case 0x13:
    regex_error::regex_error
              ((regex_error *)in_stack_fffffffffffffe40,code,
               (char *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
    this_00 = (source_location *)&stack0xfffffffffffffea8;
    source_location::source_location
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O0/KWStyle/Utilities/boost/xpressive/regex_compiler.hpp"
               ,0x240,
               "detail::sequence<BidiIter> boost::xpressive::regex_compiler<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>::parse_atom(FwdIter &, FwdIter) [BidiIter = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, RegexTraits = boost::xpressive::regex_traits<char>, CompilerTraits = boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char>>, FwdIter = const char *]"
               ,0);
    throw_exception<boost::xpressive::regex_error>
              ((regex_error *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),this_00)
    ;
  case 0x20:
    detail::
    make_dynamic<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::assert_bos_matcher>
              (in_stack_fffffffffffffe48);
    break;
  case 0x21:
    detail::
    make_dynamic<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::assert_eos_matcher>
              ((assert_eos_matcher *)in_stack_fffffffffffffe48);
    break;
  case 0x22:
    compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
    ::flags(&in_RSI->traits_);
    sVar7 = (syntax_option_type)((ulong)in_stack_fffffffffffffe38 >> 0x20);
    regex_compiler<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>
    ::rxtraits((regex_compiler<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>
                *)0x146791);
    detail::
    make_assert_begin_line<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
              (sVar7,(regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> *)
                     CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
    break;
  case 0x23:
    compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
    ::flags(&in_RSI->traits_);
    sVar7 = (syntax_option_type)((ulong)in_stack_fffffffffffffe38 >> 0x20);
    regex_compiler<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>
    ::rxtraits((regex_compiler<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>
                *)0x1467c9);
    detail::
    make_assert_end_line<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
              (sVar7,(regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> *)
                     CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
    break;
  case 0x24:
    ptVar3 = regex_compiler<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>
             ::rxtraits((regex_compiler<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>
                         *)0x14682a);
    detail::
    make_assert_word<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::word_begin,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
              (in_RDI,ptVar3);
    break;
  case 0x25:
    ptVar3 = regex_compiler<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>
             ::rxtraits((regex_compiler<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>
                         *)0x146849);
    detail::
    make_assert_word<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::word_end,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
              (in_RDI,ptVar3);
    break;
  case 0x26:
    ptVar3 = regex_compiler<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>
             ::rxtraits((regex_compiler<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>
                         *)0x1467ec);
    detail::
    make_assert_word<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::word_boundary<mpl_::bool_<true>>,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
              (in_RDI,ptVar3);
    break;
  case 0x27:
    ptVar3 = regex_compiler<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>
             ::rxtraits((regex_compiler<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_boost::xpressive::compiler_traits<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>_>
                         *)0x14680b);
    detail::
    make_assert_word<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::word_boundary<mpl_::bool_<false>>,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
              (in_RDI,ptVar3);
    break;
  case 0x2f:
LAB_00146bd6:
    detail::
    sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::sequence((sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffe40);
  }
  return begin_00;
}

Assistant:

detail::sequence<BidiIter> parse_atom(FwdIter &begin, FwdIter end)
    {
        using namespace regex_constants;
        escape_value esc = { 0, 0, 0, detail::escape_char };
        FwdIter old_begin = begin;

        switch(this->traits_.get_token(begin, end))
        {
        case token_literal:
            return detail::make_literal_xpression<BidiIter>
            (
                this->parse_literal(begin, end), this->traits_.flags(), this->rxtraits()
            );

        case token_any:
            return detail::make_any_xpression<BidiIter>(this->traits_.flags(), this->rxtraits());

        case token_assert_begin_sequence:
            return detail::make_dynamic<BidiIter>(detail::assert_bos_matcher());

        case token_assert_end_sequence:
            return detail::make_dynamic<BidiIter>(detail::assert_eos_matcher());

        case token_assert_begin_line:
            return detail::make_assert_begin_line<BidiIter>(this->traits_.flags(), this->rxtraits());

        case token_assert_end_line:
            return detail::make_assert_end_line<BidiIter>(this->traits_.flags(), this->rxtraits());

        case token_assert_word_boundary:
            return detail::make_assert_word<BidiIter>(detail::word_boundary<mpl::true_>(), this->rxtraits());

        case token_assert_not_word_boundary:
            return detail::make_assert_word<BidiIter>(detail::word_boundary<mpl::false_>(), this->rxtraits());

        case token_assert_word_begin:
            return detail::make_assert_word<BidiIter>(detail::word_begin(), this->rxtraits());

        case token_assert_word_end:
            return detail::make_assert_word<BidiIter>(detail::word_end(), this->rxtraits());

        case token_escape:
            esc = this->parse_escape(begin, end);
            switch(esc.type_)
            {
            case detail::escape_mark:
                return detail::make_backref_xpression<BidiIter>
                (
                    esc.mark_nbr_, this->traits_.flags(), this->rxtraits()
                );
            case detail::escape_char:
                return detail::make_char_xpression<BidiIter>
                (
                    esc.ch_, this->traits_.flags(), this->rxtraits()
                );
            case detail::escape_class:
                return detail::make_posix_charset_xpression<BidiIter>
                (
                    esc.class_
                  , this->is_upper_(*begin++)
                  , this->traits_.flags()
                  , this->rxtraits()
                );
            }

        case token_group_begin:
            return this->parse_group(begin, end);

        case token_charset_begin:
            return this->parse_charset(begin, end);

        case token_invalid_quantifier:
            BOOST_THROW_EXCEPTION(regex_error(error_badrepeat, "quantifier not expected"));
            break;

        case token_quote_meta_begin:
            return detail::make_literal_xpression<BidiIter>
            (
                this->parse_quote_meta(begin, end), this->traits_.flags(), this->rxtraits()
            );

        case token_quote_meta_end:
            BOOST_THROW_EXCEPTION(
                regex_error(
                    error_escape
                  , "found quote-meta end without corresponding quote-meta begin"
                )
            );
            break;

        case token_end_of_pattern:
            break;

        default:
            begin = old_begin;
            break;
        }

        return detail::sequence<BidiIter>();
    }